

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void markRoots(void)

{
  ObjUpvalue *upvalue;
  int i;
  Value *slot;
  ObjUpvalue *local_18;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  Value *local_8;
  
  for (local_8 = vm.stack; local_8 < vm.stackTop; local_8 = local_8 + 1) {
    markValue(0x102b98);
  }
  for (iVar1 = 0; iVar1 < vm.frameCount; iVar1 = iVar1 + 1) {
    markObject((Obj *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  }
  for (local_18 = vm.openUpvalues; local_18 != (ObjUpvalue *)0x0; local_18 = local_18->next) {
    markObject((Obj *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  }
  markTable((Table *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  markCompilerRoots();
  markObject((Obj *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  return;
}

Assistant:

static void markRoots() {
    //Marking the stack covers local variables and temporaries
    for (Value *slot = vm.stack; slot < vm.stackTop; slot++) {
        markValue(*slot);
    }

    //Mark VM Frames closure
    for (int i = 0; i < vm.frameCount; i++) {
        markObject((Obj *) vm.frames[i].closure);
    }

    //Mark Upvalue list
    for (ObjUpvalue *upvalue = vm.openUpvalues;
         upvalue != NULL;
         upvalue = upvalue->next) {
        markObject((Obj *) upvalue);
    }

    //Mark global variables
    markTable(&vm.globals);

    //Mark Compiler Roots
    markCompilerRoots();

    markObject((Obj*)vm.initString);
}